

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int Gia_NodeRef_rec(Gia_Man_t *p,Gia_Obj_t *pNode,int fMark)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  uVar3 = (uint)*(undefined8 *)pNode;
  if ((~uVar3 & 0x9fffffff) == 0) {
    return 0;
  }
  if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x456,"int Gia_NodeRef_rec(Gia_Man_t *, Gia_Obj_t *, int)");
  }
  if (fMark != 0) {
    pGVar1 = p->pObjs;
    if ((pNode < pGVar1) || (pGVar1 + p->nObjs <= pNode)) goto LAB_002415fc;
    iVar4 = (int)((long)pNode - (long)pGVar1 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= iVar4) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    p->pTravIds[iVar4] = p->nTravIds;
  }
  pGVar1 = pNode + -(ulong)((uint)*(undefined8 *)pNode & 0x1fffffff);
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pGVar1) && (pGVar1 < pGVar2 + p->nObjs)) {
    iVar5 = (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555;
    iVar4 = p->pRefs[iVar5];
    p->pRefs[iVar5] = iVar4 + 1;
    iVar5 = 0;
    if (iVar4 == 0) {
      iVar5 = Gia_NodeRef_rec(p,pGVar1,fMark);
    }
    pGVar1 = pNode + -(ulong)(*(uint *)&pNode->field_0x4 & 0x1fffffff);
    pGVar2 = p->pObjs;
    if ((pGVar2 <= pGVar1) && (pGVar1 < pGVar2 + p->nObjs)) {
      iVar6 = (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555;
      iVar4 = p->pRefs[iVar6];
      p->pRefs[iVar6] = iVar4 + 1;
      if (iVar4 == 0) {
        iVar4 = Gia_NodeRef_rec(p,pGVar1,fMark);
        iVar5 = iVar5 + iVar4;
      }
      return iVar5 + 1;
    }
  }
LAB_002415fc:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_NodeRef_rec( Gia_Man_t * p, Gia_Obj_t * pNode, int fMark )
{
    Gia_Obj_t * pFanin;
    int Counter = 0;
    if ( Gia_ObjIsCi(pNode) )
        return 0;
    assert( Gia_ObjIsAnd(pNode) );
    if ( fMark ) Gia_ObjSetTravIdCurrent(p, pNode);
    pFanin = Gia_ObjFanin0(pNode);
    if ( Gia_ObjRefInc(p, pFanin) == 0 )
        Counter += Gia_NodeRef_rec( p, pFanin, fMark );
    pFanin = Gia_ObjFanin1(pNode);
    if ( Gia_ObjRefInc(p, pFanin) == 0 )
        Counter += Gia_NodeRef_rec( p, pFanin, fMark );
    return Counter + 1;
}